

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void tricore_tcg_init(uc_struct_conflict15 *uc)

{
  TCGContext_conflict9 *pTVar1;
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 pTVar2;
  TCGContext_conflict9 *tcg_ctx;
  long lVar3;
  
  pTVar1 = uc->tcg_ctx;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 4) {
    pTVar2 = tcg_global_mem_new_i32
                       (uc->tcg_ctx,pTVar1->cpu_env,lVar3,
                        (char *)((long)&regnames_a_rel +
                                (long)*(int *)((long)&regnames_a_rel + lVar3)));
    *(TCGv_i32 *)((long)pTVar1->cpu_gpr_a + lVar3 * 2) = pTVar2;
  }
  for (lVar3 = 0; tcg_ctx_00 = uc->tcg_ctx, lVar3 != 0x40; lVar3 = lVar3 + 4) {
    pTVar2 = tcg_global_mem_new_i32
                       (tcg_ctx_00,pTVar1->cpu_env,lVar3 + 0x40,
                        (char *)((long)&regnames_d_rel +
                                (long)*(int *)((long)&regnames_d_rel + lVar3)));
    *(TCGv_i32 *)((long)pTVar1->cpu_gpr_d + lVar3 * 2) = pTVar2;
  }
  pTVar2 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x80,"PCXI");
  tcg_ctx_00->cpu_PCXI = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x84,"PSW");
  tcg_ctx_00->cpu_PSW = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x9c,"PC");
  tcg_ctx_00->cpu_PC = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0xb8,"ICR");
  tcg_ctx_00->cpu_ICR = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(uc->tcg_ctx,pTVar1->cpu_env,0x88,"PSW_C");
  pTVar1->cpu_PSW_C = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(uc->tcg_ctx,pTVar1->cpu_env,0x8c,"PSW_V");
  pTVar1->cpu_PSW_V = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(uc->tcg_ctx,pTVar1->cpu_env,0x90,"PSW_SV");
  pTVar1->cpu_PSW_SV = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(uc->tcg_ctx,pTVar1->cpu_env,0x94,"PSW_AV");
  pTVar1->cpu_PSW_AV = pTVar2;
  pTVar2 = tcg_global_mem_new_i32(uc->tcg_ctx,pTVar1->cpu_env,0x98,"PSW_SAV");
  pTVar1->cpu_PSW_SAV = pTVar2;
  return;
}

Assistant:

void tricore_tcg_init(struct uc_struct *uc)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;
    int i;

    /* reg init */
    for (i = 0 ; i < 16 ; i++) {
        tcg_ctx->cpu_gpr_a[i] = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                          offsetof(CPUTriCoreState, gpr_a[i]),
                                          regnames_a[i]);
    }
    for (i = 0 ; i < 16 ; i++) {
        tcg_ctx->cpu_gpr_d[i] = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                           offsetof(CPUTriCoreState, gpr_d[i]),
                                           regnames_d[i]);
    }
    tricore_tcg_init_csfr(uc);
    /* init PSW flag cache */
    tcg_ctx->cpu_PSW_C = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                   offsetof(CPUTriCoreState, PSW_USB_C),
                                   "PSW_C");
    tcg_ctx->cpu_PSW_V = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                   offsetof(CPUTriCoreState, PSW_USB_V),
                                   "PSW_V");
    tcg_ctx->cpu_PSW_SV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                    offsetof(CPUTriCoreState, PSW_USB_SV),
                                    "PSW_SV");
    tcg_ctx->cpu_PSW_AV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                    offsetof(CPUTriCoreState, PSW_USB_AV),
                                    "PSW_AV");
    tcg_ctx->cpu_PSW_SAV = tcg_global_mem_new(uc->tcg_ctx, tcg_ctx->cpu_env,
                                     offsetof(CPUTriCoreState, PSW_USB_SAV),
                                     "PSW_SAV");
}